

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__zhuffman_decode(stbi__zbuf *a,stbi__zhuffman *z)

{
  ushort uVar1;
  int iVar2;
  stbi__zbuf *in_RSI;
  stbi__zbuf *in_RDI;
  int s;
  int b;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_4;
  
  if (in_RDI->num_bits < 0x10) {
    iVar2 = stbi__zeof(in_RDI);
    if (iVar2 == 0) {
      stbi__fill_bits((stbi__zbuf *)0x1c0098);
    }
    else {
      if (in_RDI->hit_zeof_once != 0) {
        return -1;
      }
      in_RDI->hit_zeof_once = 1;
      in_RDI->num_bits = in_RDI->num_bits + 0x10;
    }
  }
  uVar1 = (in_RSI->z_length).fast[(ulong)(in_RDI->code_buffer & 0x1ff) - 0x1e];
  local_4 = (uint)uVar1;
  if (local_4 == 0) {
    local_4 = stbi__zhuffman_decode_slowpath
                        (in_RSI,(stbi__zhuffman *)(ulong)CONCAT24(uVar1,in_stack_ffffffffffffffe0));
  }
  else {
    in_RDI->code_buffer = in_RDI->code_buffer >> ((byte)((int)local_4 >> 9) & 0x1f);
    in_RDI->num_bits = in_RDI->num_bits - ((int)local_4 >> 9);
    local_4 = local_4 & 0x1ff;
  }
  return local_4;
}

Assistant:

stbi_inline static int stbi__zhuffman_decode(stbi__zbuf *a, stbi__zhuffman *z)
{
   int b,s;
   if (a->num_bits < 16) {
      if (stbi__zeof(a)) {
         if (!a->hit_zeof_once) {
            // This is the first time we hit eof, insert 16 extra padding btis
            // to allow us to keep going; if we actually consume any of them
            // though, that is invalid data. This is caught later.
            a->hit_zeof_once = 1;
            a->num_bits += 16; // add 16 implicit zero bits
         } else {
            // We already inserted our extra 16 padding bits and are again
            // out, this stream is actually prematurely terminated.
            return -1;
         }
      } else {
         stbi__fill_bits(a);
      }
   }
   b = z->fast[a->code_buffer & STBI__ZFAST_MASK];
   if (b) {
      s = b >> 9;
      a->code_buffer >>= s;
      a->num_bits -= s;
      return b & 511;
   }
   return stbi__zhuffman_decode_slowpath(a, z);
}